

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O0

void __thiscall spatial_region::birth_from_vacuum(spatial_region *this,double q)

{
  particle *ppVar1;
  particle *this_00;
  cellp ***pppcVar2;
  spatial_region *in_RDI;
  particle *__args;
  double dVar3;
  int k;
  int j;
  int i;
  particle *p2;
  particle *p1;
  double a;
  vector3d direction;
  vector3d position;
  vector3d b;
  vector3d e;
  particle *in_stack_ffffffffffffff08;
  int i_00;
  particle *in_stack_ffffffffffffff10;
  particle *in_stack_ffffffffffffff18;
  particle *in_stack_ffffffffffffff20;
  vector3d *in_stack_ffffffffffffff38;
  vector3d *in_stack_ffffffffffffff40;
  spatial_region *in_stack_ffffffffffffff48;
  spatial_region *in_stack_ffffffffffffff50;
  spatial_region *in_stack_ffffffffffffff58;
  int local_94;
  int local_90;
  int local_8c;
  vector3d local_70;
  double local_58;
  double local_50;
  double *z;
  vector3d *in_stack_ffffffffffffffc0;
  vector3d *in_stack_ffffffffffffffc8;
  spatial_region *in_stack_ffffffffffffffd0;
  vector3d local_28;
  
  if (qed_enabled) {
    vector3d::vector3d(&local_28);
    vector3d::vector3d((vector3d *)&stack0xffffffffffffffc0);
    vector3d::vector3d((vector3d *)&local_58);
    vector3d::vector3d(&local_70);
    local_70.x = 1.0;
    local_70.y = 0.0;
    local_70.z = 0.0;
    for (local_8c = 2; local_8c < in_RDI->nx + -2; local_8c = local_8c + 1) {
      for (local_90 = 2; local_90 < in_RDI->ny + -2; local_90 = local_90 + 1) {
        for (local_94 = 2; local_94 < in_RDI->nz + -2; local_94 = local_94 + 1) {
          local_58 = (double)local_8c + 0.5;
          local_50 = (double)local_90 + 0.5;
          z = (double *)((double)local_94 + 0.5);
          e_to_particle(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->x,
                        &in_stack_ffffffffffffffc0->x,z);
          b_to_particle(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->x,
                        &in_stack_ffffffffffffffc0->x,z);
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff38;
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffff40;
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff48;
          __args = (particle *)get_rand(in_RDI);
          dVar3 = mathcal_W(in_stack_ffffffffffffff58,(vector3d *)in_stack_ffffffffffffff50,
                            (vector3d *)in_stack_ffffffffffffff48);
          if ((double)__args < dVar3 * in_RDI->dt * in_RDI->dx * in_RDI->dy * in_RDI->dz) {
            ppVar1 = bear_particle(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48,
                                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                   (double)in_RDI,(double)__args,(double)in_stack_ffffffffffffff20);
            std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::operator()
                      ((function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)in_RDI,
                       __args,(vector3d *)in_stack_ffffffffffffff20,
                       (vector3d *)in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->x);
            this_00 = bear_particle(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48,
                                    in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                    (double)in_RDI,(double)__args,(double)in_stack_ffffffffffffff20)
            ;
            std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::operator()
                      ((function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)in_RDI,
                       __args,(vector3d *)in_stack_ffffffffffffff20,
                       (vector3d *)in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->x);
            ppVar1->next = this_00;
            this_00->previous = ppVar1;
            i_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
            pppcVar2 = field3d<cellp>::operator[]((field3d<cellp> *)in_stack_ffffffffffffff10,i_00);
            if ((*pppcVar2)[local_90][local_94].pl.head == (particle *)0x0) {
              pppcVar2 = field3d<cellp>::operator[]
                                   ((field3d<cellp> *)in_stack_ffffffffffffff10,i_00);
              (*pppcVar2)[local_90][local_94].pl.head = ppVar1;
              in_stack_ffffffffffffff20 = ppVar1;
            }
            else {
              pppcVar2 = field3d<cellp>::operator[]
                                   ((field3d<cellp> *)in_stack_ffffffffffffff10,i_00);
              this_00->next = (*pppcVar2)[local_90][local_94].pl.head;
              pppcVar2 = field3d<cellp>::operator[]((field3d<cellp> *)this_00,i_00);
              ((*pppcVar2)[local_90][local_94].pl.head)->previous = this_00;
              pppcVar2 = field3d<cellp>::operator[]((field3d<cellp> *)this_00,i_00);
              (*pppcVar2)[local_90][local_94].pl.head = ppVar1;
              in_stack_ffffffffffffff10 = this_00;
              in_stack_ffffffffffffff18 = ppVar1;
            }
            pppcVar2 = field3d<cellp>::operator[]((field3d<cellp> *)in_stack_ffffffffffffff10,i_00);
            in_stack_ffffffffffffff08 = (*pppcVar2)[local_90][local_94].pl.head;
            pppcVar2 = field3d<cellp>::operator[]
                                 ((field3d<cellp> *)in_stack_ffffffffffffff10,
                                  (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            (*pppcVar2)[local_90][local_94].pl.start = in_stack_ffffffffffffff08;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::birth_from_vacuum(double q)
{
    if (!qed_enabled)
        return;
    #ifndef QUILL_NOQED
    vector3d e,b;
    vector3d position;
    vector3d direction;
    direction.x = 1;
    direction.y = 0;
    direction.z = 0;
    double a = -dt/2;
    particle* p1;
    particle* p2;
    // границы взяты из ndfx для поля e
    for(int i=2;i<nx-2;i++)
    {
        for(int j=2;j<ny-2;j++)
        {
            for(int k=2;k<nz-2;k++)
            {
                /* 0.5 - чтобы избежать пересечений, вызванных очень
                 * незначительными смещениями */
                position.x = i + 0.5;
                position.y = j + 0.5;
                position.z = k + 0.5;
                e = e_to_particle(position.x,position.y,position.z);
                b = b_to_particle(position.x,position.y,position.z);
                if (get_rand()<mathcal_W(e,b)*dt*dx*dy*dz)
                {
                    /* начальное направление движения безразлично при
                     * g = 1 */
                    p1 = bear_particle(-1,position,direction,1,0,-q);
                    advance_momentum(*p1, e, b, a);
                    p2 = bear_particle(1,position,direction,1,0,q);
                    advance_momentum(*p2, e, b, a);
                    p1->next = p2;
                    p2->previous = p1;
                    if (cp[i][j][k].pl.head==0)
                    {
                        cp[i][j][k].pl.head = p1;
                    }
                    else
                    {
                        p2->next = cp[i][j][k].pl.head;
                        cp[i][j][k].pl.head->previous = p2;
                        cp[i][j][k].pl.head = p1;
                    }
                    cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                }
            }
        }
    }
    #endif
}